

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFile.cpp
# Opt level: O0

void __thiscall higan::LogFile::RollFile(LogFile *this)

{
  undefined1 local_40 [8];
  undefined1 local_38 [8];
  string file_name;
  bool result;
  LogFile *this_local;
  
  file_name.field_2._M_local_buf[0xf] = System::MakeDirIfNotExist(&this->log_dir_,true);
  if (!(bool)file_name.field_2._M_local_buf[0xf]) {
    fprintf(_stderr,"create log dir failed\n");
  }
  GetFileName_abi_cxx11_((string *)local_38,this);
  std::make_unique<higan::FileForAppend,std::__cxx11::string&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
  std::unique_ptr<higan::FileForAppend,_std::default_delete<higan::FileForAppend>_>::operator=
            (&this->file_ptr_,
             (unique_ptr<higan::FileForAppend,_std::default_delete<higan::FileForAppend>_> *)
             local_40);
  std::unique_ptr<higan::FileForAppend,_std::default_delete<higan::FileForAppend>_>::~unique_ptr
            ((unique_ptr<higan::FileForAppend,_std::default_delete<higan::FileForAppend>_> *)
             local_40);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void LogFile::RollFile()
{
	bool result = System::MakeDirIfNotExist(log_dir_, true);
	if (!result)
	{
		fprintf(stderr, "create log dir failed\n");
	}

	std::string file_name = GetFileName();
	file_ptr_ = std::make_unique<FileForAppend>(file_name);
}